

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CriticalSectionsBuilder.cpp
# Opt level: O0

void __thiscall CriticalSectionsBuilder::preVisit(CriticalSectionsBuilder *this,Node *node)

{
  type *ptVar1;
  set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *in_RSI;
  set<UnlockNode_*,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_> *in_RDI;
  type *unlockNode;
  Node *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffe8;
  undefined7 in_stack_ffffffffffffffe9;
  
  std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::insert
            (in_RSI,(value_type *)CONCAT71(in_stack_ffffffffffffffe9,in_stack_ffffffffffffffe8));
  ptVar1 = castNode<(NodeType)4,Node>(in_stack_ffffffffffffffc8);
  if (ptVar1 != (type *)0x0) {
    std::set<UnlockNode_*,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_>::erase
              (in_RDI,(key_type *)in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void CriticalSectionsBuilder::preVisit(Node *node) {
    visited_.insert(node);
    if (auto *unlockNode = castNode<NodeType::UNLOCK>(node)) {
        currentUnlocks.erase(unlockNode);
    }
}